

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall
glslang::TType::TType(TType *this,TSampler *sampler,TStorageQualifier q,TArraySizes *as)

{
  undefined1 *puVar1;
  
  this->_vptr_TType = (_func_int **)&PTR__TType_00b08c38;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xf0000000 | 0x10e;
  this->arraySizes = as;
  (this->field_13).structure = (TTypeList *)0x0;
  this->fieldName = (TString *)0x0;
  this->typeName = (TString *)0x0;
  this->sampler = *sampler;
  this->typeParameters = (TTypeParameters *)0x0;
  this->spirvType = (TSpirvType *)0x0;
  (this->qualifier).semanticName = (char *)0x0;
  puVar1 = &(this->qualifier).field_0x8;
  *(ulong *)puVar1 = *(ulong *)puVar1 & 0xf800001401ff0000;
  TQualifier::clearLayout(&this->qualifier);
  (this->qualifier).spirvStorageClass = -1;
  (this->qualifier).spirvDecorate = (TSpirvDecorate *)0x0;
  *(ulong *)&(this->qualifier).field_0x8 =
       *(ulong *)&(this->qualifier).field_0x8 & 0xe3ffffe7fe00ff80 | (ulong)(q & 0x7f);
  return;
}

Assistant:

TType(const TSampler& sampler, TStorageQualifier q = EvqUniform, TArraySizes* as = nullptr) :
        basicType(EbtSampler), vectorSize(1u), matrixCols(0u), matrixRows(0u), vector1(false), coopmatNV(false), coopmatKHR(false), coopmatKHRuse(0), coopmatKHRUseValid(false), coopvecNV(false),
        arraySizes(as), structure(nullptr), fieldName(nullptr), typeName(nullptr),
        sampler(sampler), typeParameters(nullptr), spirvType(nullptr)
    {
        qualifier.clear();
        qualifier.storage = q;
    }